

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_buf.c
# Opt level: O0

void yajl_buf_ensure_available(yajl_buf buf,size_t want)

{
  long lVar1;
  ulong in_RSI;
  long *in_RDI;
  size_t need;
  long local_18;
  
  if (in_RDI[2] == 0) {
    *in_RDI = 0x800;
    lVar1 = (**(code **)in_RDI[3])(*(undefined8 *)(in_RDI[3] + 0x18),*in_RDI);
    in_RDI[2] = lVar1;
    *(undefined1 *)in_RDI[2] = 0;
  }
  for (local_18 = *in_RDI; (ulong)(local_18 - in_RDI[1]) <= in_RSI; local_18 = local_18 << 1) {
  }
  if (local_18 != *in_RDI) {
    lVar1 = (**(code **)(in_RDI[3] + 8))(*(undefined8 *)(in_RDI[3] + 0x18),in_RDI[2],local_18);
    in_RDI[2] = lVar1;
    *in_RDI = local_18;
  }
  return;
}

Assistant:

static
void yajl_buf_ensure_available(yajl_buf buf, size_t want)
{
    size_t need;
    
    assert(buf != NULL);

    /* first call */
    if (buf->data == NULL) {
        buf->len = YAJL_BUF_INIT_SIZE;
        buf->data = (unsigned char *) YA_MALLOC(buf->alloc, buf->len);
        buf->data[0] = 0;
    }

    need = buf->len;

    while (want >= (need - buf->used)) need <<= 1;

    if (need != buf->len) {
        buf->data = (unsigned char *) YA_REALLOC(buf->alloc, buf->data, need);
        buf->len = need;
    }
}